

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.h
# Opt level: O1

void __thiscall
icu_63::UnicodeSet::add(UnicodeSet *this,UChar32 *other,int32_t otherLen,int8_t polarity)

{
  int32_t iVar1;
  UChar32 *pUVar2;
  UChar32 *pUVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  UChar32 UVar8;
  long lVar9;
  UChar32 UVar10;
  UErrorCode status;
  undefined8 uStack_28;
  
  if (((this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) &&
      (other != (UChar32 *)0x0)) && ((this->fFlags & 1) == 0)) {
    uStack_28 = 0;
    ensureBufferCapacity(this,otherLen + this->len,(UErrorCode *)((long)&uStack_28 + 4));
    if (uStack_28._4_4_ < 1) {
      pUVar2 = this->list;
      pUVar3 = this->buffer;
      UVar8 = *pUVar2;
      UVar10 = *other;
      uVar5 = 0;
      iVar6 = 1;
      iVar7 = 1;
switchD_002e90d6_default:
      iVar4 = (int)uVar5;
      switch(polarity) {
      case '\0':
        if (UVar8 < UVar10) {
          if ((iVar4 < 1) || (pUVar3[uVar5 - 1] < UVar8)) {
            uVar5 = (ulong)(iVar4 + 1);
            pUVar3[iVar4] = UVar8;
            UVar8 = pUVar2[iVar6];
          }
          else {
            uVar5 = (ulong)(iVar4 - 1);
            UVar8 = pUVar3[uVar5];
            if (pUVar3[uVar5] < pUVar2[iVar6]) {
              UVar8 = pUVar2[iVar6];
            }
          }
          iVar6 = iVar6 + 1;
          polarity = '\x01';
          goto switchD_002e90d6_default;
        }
        if (UVar10 < UVar8) {
          if ((iVar4 < 1) || (pUVar3[uVar5 - 1] < UVar10)) {
            uVar5 = (ulong)(iVar4 + 1);
            pUVar3[iVar4] = UVar10;
            UVar10 = other[iVar7];
          }
          else {
            uVar5 = (ulong)(iVar4 - 1);
            UVar10 = pUVar3[uVar5];
            if (pUVar3[uVar5] < other[iVar7]) {
              UVar10 = other[iVar7];
            }
          }
          iVar7 = iVar7 + 1;
          polarity = '\x02';
          goto switchD_002e90d6_default;
        }
        if (UVar8 == 0x110000) {
LAB_002e92a9:
          pUVar3 = this->buffer;
          pUVar3[iVar4] = 0x110000;
          this->len = iVar4 + 1;
          this->list = pUVar3;
          this->buffer = pUVar2;
          iVar1 = this->capacity;
          this->capacity = this->bufferCapacity;
          this->bufferCapacity = iVar1;
          if (this->pat == (char16_t *)0x0) {
            return;
          }
          uprv_free_63(this->pat);
          this->pat = (char16_t *)0x0;
          this->patLen = 0;
          return;
        }
        if ((iVar4 < 1) || (pUVar3[uVar5 - 1] < UVar8)) {
          uVar5 = (ulong)(iVar4 + 1);
          pUVar3[iVar4] = UVar8;
          UVar8 = pUVar2[iVar6];
        }
        else {
          uVar5 = (ulong)(iVar4 - 1);
          UVar8 = pUVar3[uVar5];
          if (pUVar3[uVar5] < pUVar2[iVar6]) {
            UVar8 = pUVar2[iVar6];
          }
        }
        iVar6 = iVar6 + 1;
        break;
      case '\x01':
        if (UVar8 < UVar10) {
          uVar5 = (ulong)(iVar4 + 1);
          pUVar3[iVar4] = UVar8;
          lVar9 = (long)iVar6;
          iVar6 = iVar6 + 1;
          UVar8 = pUVar2[lVar9];
          polarity = '\0';
          goto switchD_002e90d6_default;
        }
        if (UVar8 <= UVar10) {
          if (UVar8 == 0x110000) goto LAB_002e92a9;
          lVar9 = (long)iVar6;
          iVar6 = iVar6 + 1;
          UVar8 = pUVar2[lVar9];
          lVar9 = (long)iVar7;
          iVar7 = iVar7 + 1;
          UVar10 = other[lVar9];
          polarity = '\x02';
          goto switchD_002e90d6_default;
        }
        break;
      case '\x02':
        if (UVar10 < UVar8) {
          pUVar3[iVar4] = UVar10;
          goto LAB_002e9187;
        }
        if (UVar8 < UVar10) {
          lVar9 = (long)iVar6;
          iVar6 = iVar6 + 1;
          UVar8 = pUVar2[lVar9];
          polarity = '\x03';
        }
        else {
          if (UVar8 == 0x110000) goto LAB_002e92a9;
          lVar9 = (long)iVar6;
          iVar6 = iVar6 + 1;
          UVar8 = pUVar2[lVar9];
          lVar9 = (long)iVar7;
          iVar7 = iVar7 + 1;
          UVar10 = other[lVar9];
          polarity = '\x01';
        }
        goto switchD_002e90d6_default;
      case '\x03':
        if (UVar8 < UVar10) {
          UVar8 = UVar10;
        }
        if (UVar8 == 0x110000) goto LAB_002e92a9;
        pUVar3[iVar4] = UVar8;
        lVar9 = (long)iVar6;
        iVar6 = iVar6 + 1;
        UVar8 = pUVar2[lVar9];
LAB_002e9187:
        uVar5 = (ulong)(iVar4 + 1);
        lVar9 = (long)iVar7;
        iVar7 = iVar7 + 1;
        UVar10 = other[lVar9];
        polarity = '\0';
      default:
        goto switchD_002e90d6_default;
      }
      lVar9 = (long)iVar7;
      iVar7 = iVar7 + 1;
      UVar10 = other[lVar9];
      polarity = '\x03';
      goto switchD_002e90d6_default;
    }
  }
  return;
}

Assistant:

inline UBool UnicodeSet::isFrozen() const {
    return (UBool)(bmpSet!=NULL || stringSpan!=NULL);
}